

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# complexwidgets.cpp
# Opt level: O0

State __thiscall QAccessibleComboBox::state(QAccessibleComboBox *this)

{
  long lVar1;
  ulong uVar2;
  bool bVar3;
  uint uVar4;
  State SVar5;
  QComboBox *pQVar6;
  QAbstractItemView *pQVar7;
  QAccessibleWidget *in_RDI;
  long in_FS_OFFSET;
  QComboBox *cBox;
  State s;
  uint7 in_stack_ffffffffffffffd0;
  bool bVar8;
  State local_10;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  SVar5 = QAccessibleWidget::state(in_RDI);
  local_10._0_5_ = SVar5._0_5_;
  local_10._5_3_ = 0xaaaaaa;
  pQVar6 = comboBox((QAccessibleComboBox *)0x7d5381);
  if (pQVar6 != (QComboBox *)0x0) {
    uVar2 = CONCAT44(local_10._4_4_,SVar5._0_4_) & 0xffffffffffffbfff;
    uVar4 = (**(code **)(*(long *)in_RDI + 0x10))();
    bVar8 = false;
    if ((uVar4 & 1) != 0) {
      pQVar7 = QComboBox::view((QComboBox *)(ulong)in_stack_ffffffffffffffd0);
      bVar8 = false;
      if (pQVar7 != (QAbstractItemView *)0x0) {
        QComboBox::view((QComboBox *)(ulong)in_stack_ffffffffffffffd0);
        bVar8 = QWidget::isVisible((QWidget *)0x7d53e9);
      }
    }
    bVar3 = QComboBox::isEditable((QComboBox *)CONCAT17(bVar8,in_stack_ffffffffffffffd0));
    local_10._4_1_ = SUB81(uVar2 >> 0x20,0);
    local_10._5_3_ = SUB83(uVar2 >> 0x28,0);
    local_10._4_1_ = local_10._4_1_ & 0xfe | bVar3;
    local_10._0_4_ = (uint)uVar2 & 0xfffff7ff | 0x4000 | (uint)bVar8 << 0xb;
  }
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_10;
}

Assistant:

QAccessible::State QAccessibleComboBox::state() const
{
    QAccessible::State s = QAccessibleWidget::state();

    if (QComboBox *cBox = comboBox()) {
        s.expandable = true;
        s.expanded = isValid() && cBox->view() && cBox->view()->isVisible();
        s.editable = cBox->isEditable();
    }
    return s;
}